

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t tree_target_is_same_as_parent(tree *t,stat *st)

{
  tree_entry *local_28;
  tree_entry *te;
  stat *st_local;
  tree *t_local;
  
  local_28 = t->current->parent;
  while( true ) {
    if (local_28 == (tree_entry *)0x0) {
      return L'\0';
    }
    if ((local_28->dev == st->st_dev) && (local_28->ino == st->st_ino)) break;
    local_28 = local_28->parent;
  }
  return L'\x01';
}

Assistant:

static int
tree_target_is_same_as_parent(struct tree *t, const struct stat *st)
{
	struct tree_entry *te;

	for (te = t->current->parent; te != NULL; te = te->parent) {
		if (te->dev == (int64_t)st->st_dev &&
		    te->ino == (int64_t)st->st_ino)
			return (1);
	}
	return (0);
}